

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::DictionaryTypeHandlerBase<int>::IsObjTypeSpecEquivalent
          (DictionaryTypeHandlerBase<int> *this,Type *type,TypeEquivalenceRecord *record,
          uint *failedPropertyIndex)

{
  uint uVar1;
  EquivalentPropertyEntry *pEVar2;
  bool bVar3;
  EquivalentPropertyEntry *refInfo;
  uint pi;
  EquivalentPropertyEntry *properties;
  uint propertyCount;
  uint *failedPropertyIndex_local;
  TypeEquivalenceRecord *record_local;
  Type *type_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  uVar1 = record->propertyCount;
  pEVar2 = record->properties;
  refInfo._4_4_ = 0;
  while( true ) {
    if (uVar1 <= refInfo._4_4_) {
      return true;
    }
    bVar3 = IsObjTypeSpecEquivalentImpl<false>(this,type,pEVar2 + refInfo._4_4_);
    if (!bVar3) break;
    refInfo._4_4_ = refInfo._4_4_ + 1;
  }
  *failedPropertyIndex = refInfo._4_4_;
  return false;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        uint propertyCount = record.propertyCount;
        EquivalentPropertyEntry* properties = record.properties;
        for (uint pi = 0; pi < propertyCount; pi++)
        {
            const EquivalentPropertyEntry* refInfo = &properties[pi];
            if (!this->IsObjTypeSpecEquivalentImpl<false>(type, refInfo))
            {
                failedPropertyIndex = pi;
                return false;
            }
        }

        return true;
    }